

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

void __thiscall cmStateSnapshot::SetDirectoryDefinitions(cmStateSnapshot *this)

{
  char *pcVar1;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  cmStateSnapshot *local_10;
  cmStateSnapshot *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"CMAKE_SOURCE_DIR",&local_31);
  pcVar1 = cmState::GetSourceDirectory(this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,pcVar1,&local_69);
  SetDefinition(this,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"CMAKE_CURRENT_SOURCE_DIR",&local_91);
  pcVar1 = cmState::GetSourceDirectory(this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,pcVar1,&local_b9);
  SetDefinition(this,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"CMAKE_BINARY_DIR",&local_e1);
  pcVar1 = cmState::GetBinaryDirectory(this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,pcVar1,&local_109);
  SetDefinition(this,&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"CMAKE_CURRENT_BINARY_DIR",&local_131);
  pcVar1 = cmState::GetBinaryDirectory(this->State);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,pcVar1,&local_159);
  SetDefinition(this,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  return;
}

Assistant:

void cmStateSnapshot::SetDirectoryDefinitions()
{
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->State->GetBinaryDirectory());
}